

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  undefined1 *puVar1;
  ushort uVar2;
  char cVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  int iVar11;
  uint uVar12;
  ulong *puVar13;
  ulong uVar14;
  bool bVar15;
  ulong *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar5 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar5;
  }
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar6 = 0;
      uVar14 = 0;
      puVar10 = (ulong *)0x0;
      cSrc = (ulong *)0x0;
      puVar13 = (ulong *)0x0;
    }
    else {
      puVar13 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar14 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar14 = uVar14 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar4 = (uint)bVar7;
          if (bVar7 == 0) {
            cSrcSize = 0xffffffffffffffec;
          }
          else {
            uVar4 = (LZCOUNT((uint)bVar7) ^ 0xffffffe0U) + (int)cSrcSize * -8 + 0x49;
          }
          uVar6 = (ulong)uVar4;
          puVar10 = (ulong *)cSrc;
        }
      }
      else {
        puVar10 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar14 = *puVar10;
        bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar4 = (LZCOUNT((uint)bVar7) ^ 0xffffffe0U) + 9;
        if (bVar7 == 0) {
          uVar4 = (uint)bVar7;
        }
        uVar6 = (ulong)uVar4;
        cSrcSize = cSrcSize | -(ulong)(bVar7 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    puVar1 = (undefined1 *)((long)dst + maxDstSize);
    uVar2 = *(ushort *)((long)DTable + 2);
    if (3 < (long)maxDstSize) {
      uVar4 = -(uint)uVar2 & 0x3f;
      do {
        uVar12 = (uint)uVar6;
        if (uVar12 < 0x41) {
          if (puVar10 < puVar13) {
            if (puVar10 == (ulong *)cSrc) goto LAB_001c1822;
            bVar15 = cSrc <= (ulong *)((long)puVar10 - (uVar6 >> 3));
            uVar8 = (int)puVar10 - (int)cSrc;
            if (bVar15) {
              uVar8 = (uint)(uVar6 >> 3);
            }
            uVar12 = uVar12 + uVar8 * -8;
          }
          else {
            uVar8 = (uint)(uVar6 >> 3);
            uVar12 = uVar12 & 7;
            bVar15 = true;
          }
          uVar6 = (ulong)uVar12;
          puVar10 = (ulong *)((long)puVar10 - (ulong)uVar8);
          uVar14 = *puVar10;
        }
        else {
LAB_001c1822:
          bVar15 = false;
        }
        if ((puVar1 + -3 <= dst) || (!bVar15)) goto LAB_001c1941;
        uVar9 = (uVar14 << (uVar6 & 0x3f)) >> uVar4;
        uVar12 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + (int)uVar6;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        uVar6 = (uVar14 << ((ulong)uVar12 & 0x3f)) >> uVar4;
        uVar12 = *(byte *)((long)DTable + uVar6 * 2 + 4) + uVar12;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
        uVar6 = (uVar14 << ((ulong)uVar12 & 0x3f)) >> uVar4;
        uVar12 = *(byte *)((long)DTable + uVar6 * 2 + 4) + uVar12;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
        uVar9 = (uVar14 << ((ulong)uVar12 & 0x3f)) >> uVar4;
        uVar6 = (ulong)(*(byte *)((long)DTable + uVar9 * 2 + 4) + uVar12);
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        dst = (void *)((long)dst + 4);
      } while( true );
    }
    uVar4 = (uint)uVar6;
    if (uVar4 < 0x41) {
      if (puVar10 < puVar13) {
        if (puVar10 == (ulong *)cSrc) goto LAB_001c1941;
        uVar12 = (int)puVar10 - (int)cSrc;
        if (cSrc <= (ulong *)((long)puVar10 - (uVar6 >> 3))) {
          uVar12 = (uint)(uVar6 >> 3);
        }
        uVar4 = uVar4 + uVar12 * -8;
      }
      else {
        uVar12 = (uint)(uVar6 >> 3);
        uVar4 = uVar4 & 7;
      }
      uVar6 = (ulong)uVar4;
      puVar10 = (ulong *)((long)puVar10 - (ulong)uVar12);
      uVar14 = *puVar10;
    }
LAB_001c1941:
    if (dst < puVar1) {
      do {
        uVar9 = (uVar14 << (uVar6 & 0x3f)) >> (-(uint)uVar2 & 0x3f);
        uVar4 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + (int)uVar6;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        dst = (void *)((long)dst + 1);
        uVar6 = (ulong)uVar4;
      } while (dst < puVar1);
    }
    else {
      uVar4 = (uint)uVar6;
    }
    if (uVar4 != 0x40) {
      maxDstSize = 0xffffffffffffffec;
    }
    if (puVar10 != (ulong *)cSrc) {
      maxDstSize = 0xffffffffffffffec;
    }
    return maxDstSize;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar6 = 0;
    uVar14 = 0;
    puVar13 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puStack_38 = (ulong *)0x0;
  }
  else {
    puStack_38 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar14 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar14 = uVar14 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar14 = uVar14 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar14 = uVar14 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar4 = 0x1f;
        if (bVar7 != 0) {
          for (; bVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        if (bVar7 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar4 = 0;
        }
        else {
          uVar4 = ~uVar4 + (int)cSrcSize * -8 + 0x49;
        }
        uVar6 = (ulong)uVar4;
        puVar13 = (ulong *)cSrc;
      }
    }
    else {
      puVar13 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar14 = *puVar13;
      bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar4 = 0x1f;
      if (bVar7 != 0) {
        for (; bVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = ~uVar4 + 9;
      if (bVar7 == 0) {
        uVar4 = 0;
      }
      uVar6 = (ulong)uVar4;
      cSrcSize = cSrcSize | -(ulong)(bVar7 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  cVar3 = (char)*(undefined2 *)((long)DTable + 2);
  if (3 < (long)maxDstSize) {
    bVar7 = -cVar3 & 0x3f;
    do {
      uVar4 = (uint)uVar6;
      if (uVar4 < 0x41) {
        if (puVar13 < puStack_38) {
          if (puVar13 == (ulong *)cSrc) goto LAB_0017ac77;
          bVar15 = cSrc <= (ulong *)((long)puVar13 - (uVar6 >> 3));
          uVar12 = (int)puVar13 - (int)cSrc;
          if (bVar15) {
            uVar12 = (uint)(uVar6 >> 3);
          }
          uVar4 = uVar4 + uVar12 * -8;
        }
        else {
          uVar12 = (uint)(uVar6 >> 3);
          uVar4 = uVar4 & 7;
          bVar15 = true;
        }
        uVar6 = (ulong)uVar4;
        puVar13 = (ulong *)((long)puVar13 - (ulong)uVar12);
        uVar14 = *puVar13;
      }
      else {
LAB_0017ac77:
        bVar15 = false;
      }
      if ((puVar1 + -3 <= dst) || (!bVar15)) goto LAB_0017ada1;
      uVar9 = (uVar14 << ((byte)uVar6 & 0x3f)) >> bVar7;
      iVar11 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + (int)uVar6;
      uVar6 = (uVar14 << ((byte)iVar11 & 0x3f)) >> bVar7;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
      iVar11 = (uint)*(byte *)((long)DTable + uVar6 * 2 + 4) + iVar11;
      uVar9 = (uVar14 << ((byte)iVar11 & 0x3f)) >> bVar7;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar6 * 2 + 5);
      iVar11 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + iVar11;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
      uVar9 = (uVar14 << ((byte)iVar11 & 0x3f)) >> bVar7;
      uVar6 = (ulong)((uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + iVar11);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar4 = (uint)uVar6;
  if (uVar4 < 0x41) {
    if (puVar13 < puStack_38) {
      if (puVar13 == (ulong *)cSrc) goto LAB_0017ada1;
      uVar12 = (int)puVar13 - (int)cSrc;
      if (cSrc <= (ulong *)((long)puVar13 - (uVar6 >> 3))) {
        uVar12 = (uint)(uVar6 >> 3);
      }
      uVar4 = uVar4 + uVar12 * -8;
    }
    else {
      uVar12 = (uint)(uVar6 >> 3);
      uVar4 = uVar4 & 7;
    }
    uVar6 = (ulong)uVar4;
    puVar13 = (ulong *)((long)puVar13 - (ulong)uVar12);
    uVar14 = *puVar13;
  }
LAB_0017ada1:
  uVar4 = (uint)uVar6;
  if (dst < puVar1) {
    do {
      uVar9 = (uVar14 << ((byte)uVar6 & 0x3f)) >> (-cVar3 & 0x3fU);
      uVar4 = (int)uVar6 + (uint)*(byte *)((long)DTable + uVar9 * 2 + 4);
      uVar6 = (ulong)uVar4;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar1);
  }
  if (uVar4 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puVar13 != (ulong *)cSrc) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}